

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O2

void __thiscall
Js::InlinedFrameWalker::FinalizeStackValues
          (InlinedFrameWalker *this,Var *args,size_t argCount,bool deepCopy)

{
  ScriptContext *scriptContext;
  JavascriptFunction *pJVar1;
  Var pvVar2;
  size_t i;
  size_t sVar3;
  
  pJVar1 = GetFunctionObject(this);
  scriptContext =
       (((((pJVar1->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  for (sVar3 = 0; argCount != sVar3; sVar3 = sVar3 + 1) {
    pvVar2 = JavascriptOperators::BoxStackInstance(args[sVar3],scriptContext,false,deepCopy);
    args[sVar3] = pvVar2;
  }
  return;
}

Assistant:

void InlinedFrameWalker::FinalizeStackValues(__in_ecount(argCount) Js::Var args[], size_t argCount, bool deepCopy) const
    {
        ScriptContext *scriptContext = this->GetFunctionObject()->GetScriptContext();

        for (size_t i = 0; i < argCount; i++)
        {
            args[i] = Js::JavascriptOperators::BoxStackInstance(args[i], scriptContext, false /*allowStackFunction*/, deepCopy);
        }
    }